

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.cc
# Opt level: O0

void __thiscall vw_ostream::vw_streambuf::sync(vw_streambuf *this)

{
  undefined8 uVar1;
  code *pcVar2;
  int ret;
  allocator local_69;
  string local_68 [48];
  string local_38 [36];
  int local_14;
  vw_streambuf *local_10;
  
  local_10 = this;
  local_14 = std::streambuf::sync();
  if (local_14 == 0) {
    uVar1 = *(undefined8 *)&(this->parent->super_ostream).field_0x78;
    pcVar2 = *(code **)&(this->parent->super_ostream).field_0x80;
    std::__cxx11::stringbuf::str();
    (*pcVar2)(uVar1,local_38);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"",&local_69);
    std::__cxx11::stringbuf::str((string *)this);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  return;
}

Assistant:

int vw_ostream::vw_streambuf::sync()
{
  int ret = std::stringbuf::sync();
  if (ret)
    return ret;

  parent.trace_listener(parent.trace_context, str());
  str("");
  return 0;  // success
}